

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::ScannersMixin::FreeBody(ScannersMixin *this,ArenaAllocator *rtAllocator)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < this->numLiterals; lVar1 = lVar1 + 1) {
    ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>::FreeBody
              (&(this->infos[lVar1].ptr)->super_ScannerMixin,rtAllocator);
    this->infos[lVar1].ptr = (ScannerInfo *)0x0;
  }
  this->numLiterals = 0;
  return;
}

Assistant:

void ScannersMixin::FreeBody(ArenaAllocator* rtAllocator)
    {
        for (int i = 0; i < numLiterals; i++)
        {
            infos[i]->FreeBody(rtAllocator);
#if DBG
            infos[i] = nullptr;
#endif
        }
#if DBG
        numLiterals = 0;
#endif
    }